

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTContext.cpp
# Opt level: O2

optional<unsigned_int> __thiscall
slang::ast::ASTContext::requireValidBitWidth(ASTContext *this,SVInt *value,SourceRange range)

{
  bool bVar1;
  _Optional_payload_base<unsigned_int> _Var2;
  Diagnostic *this_00;
  
  _Var2 = (_Optional_payload_base<unsigned_int>)SVInt::as<unsigned_int>(value);
  if (((ulong)_Var2 >> 0x20 & 1) == 0) {
    this_00 = addDiag(this,(DiagCode)0x60003,range);
    Diagnostic::operator<<<int>(this_00,0xffffff);
  }
  else {
    bVar1 = requireValidBitWidth(this,_Var2._M_payload._M_value,range);
    if (!bVar1) {
      _Var2._M_payload = (_Storage<unsigned_int,_true>)0x0;
      _Var2._M_engaged = false;
      _Var2._5_3_ = 0;
    }
  }
  return (optional<unsigned_int>)_Var2;
}

Assistant:

std::optional<bitwidth_t> ASTContext::requireValidBitWidth(const SVInt& value,
                                                           SourceRange range) const {
    auto result = value.as<bitwidth_t>();
    if (!result)
        addDiag(diag::ValueExceedsMaxBitWidth, range) << (int)SVInt::MAX_BITS;
    else if (!requireValidBitWidth(*result, range))
        return std::nullopt;
    return result;
}